

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O2

void __thiscall
QTeamCityLogger::addPendingMessage(QTeamCityLogger *this,char *type,char *msg,char *file,int line)

{
  char *pcVar1;
  long in_FS_OFFSET;
  QTestCharBuffer newMessage;
  QTestCharBuffer local_248;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = "|n";
  if (*(this->pendingMessages).buf == '\0') {
    pcVar1 = "";
  }
  memset(&local_248,0xaa,0x210);
  local_248._size = 0x200;
  local_248.buf = local_248.staticBuf;
  local_248.staticBuf[0] = '\0';
  if (file == (char *)0x0) {
    QTest::qt_asprintf(&local_248,"%s%s: %s",pcVar1,type,msg);
  }
  else {
    QTest::qt_asprintf(&local_248,"%s%s |[Loc: %s(%d)|]: %s",pcVar1,type,file,(ulong)(uint)line,msg)
    ;
  }
  QTestPrivate::appendCharBuffer(&this->pendingMessages,&local_248);
  QTestCharBuffer::~QTestCharBuffer(&local_248);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTeamCityLogger::addPendingMessage(const char *type, const char *msg,
                                        const char *file, int line)
{
    const char *pad = pendingMessages.isEmpty() ? "" : "|n";

    QTestCharBuffer newMessage;
    if (file)
        QTest::qt_asprintf(&newMessage, "%s%s |[Loc: %s(%d)|]: %s", pad, type, file, line, msg);
    else
        QTest::qt_asprintf(&newMessage, "%s%s: %s", pad, type, msg);

    QTestPrivate::appendCharBuffer(&pendingMessages, newMessage);
}